

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O3

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::dump
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this,ostream *os)

{
  char *__s;
  char cVar1;
  size_t sVar2;
  char local_1a;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"     name = ",0xc);
  __s = (this->super_sc_signal_channel).super_sc_prim_channel.super_sc_object.m_name._M_dataplus.
        _M_p;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
  }
  cVar1 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"    value = ",0xc);
  local_1a = *(char *)((long)&sc_dt::sc_logic::logic_to_char + (ulong)(this->m_cur_val).m_val);
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_1a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"new value = ",0xc);
  local_19 = *(char *)((long)&sc_dt::sc_logic::logic_to_char + (ulong)(this->m_new_val).m_val);
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void
sc_signal_t<T,POL>::dump( ::std::ostream& os ) const
{
    os << "     name = " << name() << ::std::endl;
    os << "    value = " << m_cur_val << ::std::endl;
    os << "new value = " << m_new_val << ::std::endl;
}